

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlunicode.c
# Opt level: O1

int xmlUCSIsCatNl(int code)

{
  uint uVar1;
  
  uVar1 = 1;
  if ((((2 < code - 0x16eeU) && (2 < code - 0x3038U)) && (8 < code - 0x3021U)) &&
     ((code != 0x3007 && (0x23 < code - 0x2160U)))) {
    uVar1 = (uint)(code == 0x1034a);
  }
  return uVar1;
}

Assistant:

int
xmlUCSIsCatNl(int code) {
    return(((code >= 0x16ee) && (code <= 0x16f0)) ||
           ((code >= 0x2160) && (code <= 0x2183)) ||
           (code == 0x3007) ||
           ((code >= 0x3021) && (code <= 0x3029)) ||
           ((code >= 0x3038) && (code <= 0x303a)) ||
           (code == 0x1034a));
}